

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.h
# Opt level: O3

string * DeploymentName_abi_cxx11_(string *__return_storage_ptr__,BuriedDeployment dep)

{
  string *psVar1;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,dep) < -0x7ffb) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = (string *)
             (*(code *)(&DAT_008519f0 + *(int *)(&DAT_008519f0 + (ulong)((int)dep + 0x8000) * 4)))()
    ;
    return psVar1;
  }
  __assert_fail("ValidDeployment(dep)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentinfo.cpp"
                ,0x18,"std::string DeploymentName(Consensus::BuriedDeployment)");
}

Assistant:

constexpr bool ValidDeployment(BuriedDeployment dep) { return dep <= DEPLOYMENT_SEGWIT; }